

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O1

void __thiscall BeliefSparse::BeliefSparse(BeliefSparse *this,StateDistribution *belief)

{
  size_type __n;
  double *pdVar1;
  
  *(undefined ***)this = &PTR__BeliefSparse_005cc748;
  (this->_m_b).size_ = 0;
  (this->_m_b).capacity_ = 0;
  (this->_m_b).filled_ = 0;
  (this->_m_b).index_data_.size_ = 0;
  (this->_m_b).index_data_.data_ = (pointer)0x0;
  __n = (this->_m_b).capacity_;
  (this->_m_b).value_data_.size_ = __n;
  if (__n == 0) {
    pdVar1 = (double *)0x0;
  }
  else {
    pdVar1 = __gnu_cxx::new_allocator<double>::allocate
                       ((new_allocator<double> *)&(this->_m_b).value_data_,__n,(void *)0x0);
  }
  (this->_m_b).value_data_.data_ = pdVar1;
  (**(code **)(*(long *)this + 0x28))(this,belief);
  return;
}

Assistant:

BeliefSparse::BeliefSparse(const StateDistribution& belief)
{
    this->Set(belief);
}